

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colmatrix_test.cc
# Opt level: O3

void __thiscall
fizplex::ColMatrix_MatrixMultiplicationWithZero_Test::TestBody
          (ColMatrix_MatrixMultiplicationWithZero_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  ColMatrix zero;
  ColMatrix idnt;
  AssertHelper AStack_98;
  internal local_90 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  ColMatrix local_80;
  ColMatrix local_58;
  ColMatrix local_30;
  
  ColMatrix::ColMatrix(&local_58,3,3);
  ColMatrix::identity(&local_30,3);
  ColMatrix::operator*(&local_80,&local_30,&local_58);
  testing::internal::CmpHelperEQ<fizplex::ColMatrix,fizplex::ColMatrix>
            (local_90,"zero","idnt * zero",&local_58,&local_80);
  std::vector<fizplex::SVector,_std::allocator<fizplex::SVector>_>::~vector(&local_80.cols);
  if (local_90[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (local_88.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_88.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/colmatrix_test.cc"
               ,0x60,message);
    testing::internal::AssertHelper::operator=(&AStack_98,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&AStack_98);
    if (local_80.cols.super__Vector_base<fizplex::SVector,_std::allocator<fizplex::SVector>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_80.cols.super__Vector_base<fizplex::SVector,_std::allocator<fizplex::SVector>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
        (*(code *)(((local_80.cols.
                     super__Vector_base<fizplex::SVector,_std::allocator<fizplex::SVector>_>._M_impl
                     .super__Vector_impl_data._M_start)->values).
                   super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                   ._M_impl.super__Vector_impl_data._M_start)->value)();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::vector<fizplex::SVector,_std::allocator<fizplex::SVector>_>::~vector(&local_30.cols);
  std::vector<fizplex::SVector,_std::allocator<fizplex::SVector>_>::~vector(&local_58.cols);
  return;
}

Assistant:

TEST(ColMatrix, MatrixMultiplicationWithZero) {
  const auto zero = ColMatrix(3, 3);
  const auto idnt = ColMatrix::identity(3);
  EXPECT_EQ(zero, idnt * zero);
}